

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

void __thiscall
ON_RenderContentPrivate::ON_RenderContentPrivate
          (ON_RenderContentPrivate *this,ON_RenderContent *rc,wchar_t *kind)

{
  this->_vptr_ON_RenderContentPrivate = (_func_int **)&PTR__ON_RenderContentPrivate_00818850;
  this->m_model = (ONX_Model *)0x0;
  ON_XMLNode::ON_XMLNode(&this->m_node,kind);
  this->m_render_content = rc;
  *(undefined8 *)((long)&(this->m_mutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  this->m_parent = (ON_RenderContent *)0x0;
  this->m_first_child = (ON_RenderContent *)0x0;
  this->m_next_sibling = (ON_RenderContent *)0x0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__align = 0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  return;
}

Assistant:

ON_RenderContentPrivate::ON_RenderContentPrivate(ON_RenderContent& rc, const wchar_t* kind)
  :
  m_node(kind),
  m_render_content(rc)
{
}